

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

RegexStacks * __thiscall Js::ScriptContext::AllocRegexStacks(ScriptContext *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegexStacks *this_00;
  
  if (this->regexStacks != (RegexStacks *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x4be,"(this->regexStacks == nullptr)",
                                "this->regexStacks == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = (RegexStacks *)new<Memory::ArenaAllocator>(0x68,&this->regexAllocator,0x364470);
  UnifiedRegex::RegexStacks::RegexStacks
            (this_00,&(this->threadContext->pageAllocator).super_PageAllocator);
  this->regexStacks = this_00;
  return this_00;
}

Assistant:

UnifiedRegex::RegexStacks * ScriptContext::AllocRegexStacks()
    {
        Assert(this->regexStacks == nullptr);
        UnifiedRegex::RegexStacks * stacks = Anew(RegexAllocator(), UnifiedRegex::RegexStacks, threadContext->GetPageAllocator());
        this->regexStacks = stacks;
        return stacks;
    }